

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall Validator_resetNegativeOrder_Test::TestBody(Validator_resetNegativeOrder_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  AssertHelper local_1a0 [8];
  Message local_198 [8];
  unsigned_long local_190 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  ValidatorPtr validator;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [48];
  undefined1 local_60 [8];
  ResetPtr r;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c;
  ModelPtr m;
  Validator_resetNegativeOrder_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Reset::create();
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  libcellml::Reset::setVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  libcellml::Reset::setTestVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  libcellml::Reset::setOrder((int)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  libcellml::Reset::setResetValue((string *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  libcellml::Reset::setTestValue((string *)peVar2);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"comp",&local_91);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"var",&local_b9);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"second",&local_e1);
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"var2",&local_109);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"second",&local_131);
  libcellml::Variable::setUnits((string *)peVar4);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addReset((shared_ptr *)peVar3);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"main",
             (allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar5);
  libcellml::Validator::create();
  peVar6 = std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  libcellml::Validator::validateModel((shared_ptr *)peVar6);
  local_190[1] = 0;
  std::__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  local_190[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_180,"size_t(0)","validator->issueCount()",local_190 + 1,
             local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
               ,0x626,pcVar7);
    testing::internal::AssertHelper::operator=(local_1a0,local_198);
    testing::internal::AssertHelper::~AssertHelper(local_1a0);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::shared_ptr<libcellml::Validator>::~shared_ptr
            ((shared_ptr<libcellml::Validator> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_60);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Validator, resetNegativeOrder)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Negative order value should be allowed
    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(-100);
    r->setResetValue(NON_EMPTY_MATH);
    r->setTestValue(NON_EMPTY_MATH);

    c->setName("comp");
    v1->setName("var");
    v1->setUnits("second");
    v2->setName("var2");
    v2->setUnits("second");

    c->addVariable(v1);
    c->addVariable(v2);

    c->addReset(r);

    m->setName("main");
    m->addComponent(c);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(m);

    EXPECT_EQ(size_t(0), validator->issueCount());
}